

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O1

void deflate_compress_greedy
               (libdeflate_compressor *c,u8 *in,size_t in_nbytes,deflate_output_bitstream *os)

{
  uint *puVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  int *piVar5;
  u32 *puVar6;
  byte bVar7;
  short sVar8;
  ulong uVar9;
  ushort uVar10;
  _Bool _Var11;
  u32 uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  u32 uVar18;
  uint *data;
  byte *pbVar19;
  uint uVar20;
  uint *puVar21;
  uint uVar22;
  uint *puVar23;
  uint *puVar24;
  short sVar25;
  ulong uVar26;
  ushort uVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong local_a8;
  uint local_9c;
  uint *local_98;
  long local_80;
  int local_78;
  
  local_9c = c->nice_match_length;
  lVar16 = 0x17c0;
  do {
    puVar2 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -0x28);
    *puVar2 = 0x8000800080008000;
    puVar2[1] = 0x8000800080008000;
    puVar2 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -0x18);
    *puVar2 = 0x8000800080008000;
    puVar2[1] = 0x8000800080008000;
    puVar2 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -8);
    *puVar2 = 0x8000800080008000;
    puVar2[1] = 0x8000800080008000;
    puVar2 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + 8);
    *puVar2 = 0x8000800080008000;
    puVar2[1] = 0x8000800080008000;
    lVar16 = lVar16 + 0x40;
  } while (lVar16 != 0x317c0);
  puVar21 = (uint *)(in + in_nbytes);
  local_a8 = 0x102;
  if (0x101 < local_9c) {
    local_9c = 0x102;
  }
  uVar28 = 0;
  uVar22 = 0;
  data = (uint *)in;
LAB_001011b2:
  puVar23 = data + 75000;
  if ((ulong)((long)puVar21 - (long)data) < 0x4a768) {
    puVar23 = puVar21;
  }
  (c->p).g.sequences[0].litrunlen_and_length = 0;
  memset(&c->freqs,0,0x558);
  uVar12 = calculate_min_match_len((u8 *)data,(long)puVar23 - (long)data,c->max_search_depth);
  uVar13 = uVar12 - 1;
  local_80 = 0x417c0;
  puVar24 = data;
  auVar31 = _DAT_0010d070;
LAB_00101236:
  uVar17 = (long)puVar21 - (long)puVar24;
  if ((uVar17 < 0x102) && (local_a8 = uVar17, (uint)uVar17 <= local_9c)) {
    local_9c = (uint)uVar17;
  }
  uVar18 = c->max_search_depth;
  uVar14 = (int)puVar24 - (int)in;
  if (uVar14 == 0x8000) {
    lVar16 = 0;
    do {
      auVar30 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16),auVar31);
      *(undefined1 (*) [16])((long)&c->p + lVar16) = auVar30;
      auVar30 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10),auVar31);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10) = auVar30;
      auVar30 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20),auVar31);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20) = auVar30;
      auVar30 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30),auVar31);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30) = auVar30;
      lVar16 = lVar16 + 0x40;
    } while (lVar16 != 0x40000);
    in = in + 0x8000;
    uVar14 = 0;
  }
  local_98 = puVar24;
  if ((uint)local_a8 < 5) {
LAB_00101548:
    uVar17 = (ulong)uVar13;
  }
  else {
    uVar10 = (ushort)uVar14;
    uVar27 = uVar10 ^ 0x8000;
    sVar8 = *(short *)((long)&c->p + (ulong)uVar22 * 2);
    sVar25 = *(short *)((long)&c->p + uVar28 * 2 + 0x10000);
    *(ushort *)((long)&c->p + (ulong)uVar22 * 2) = uVar10;
    *(ushort *)((long)&c->p + uVar28 * 2 + 0x10000) = uVar10;
    *(short *)((long)&c->p + (ulong)uVar14 * 2 + 0x30000) = sVar25;
    uVar22 = (*(uint *)((long)puVar24 + 1) & 0xffffff) * 0x1e35a7bd >> 0x11;
    uVar28 = (ulong)(*(uint *)((long)puVar24 + 1) * 0x1e35a7bd >> 0x10);
    uVar17 = (ulong)uVar13;
    if (3 < uVar13) {
      if ((uVar13 < local_9c) && ((short)uVar27 < sVar25)) goto LAB_001013c7;
      goto LAB_00101548;
    }
    if (sVar8 <= (short)uVar27) goto LAB_00101548;
    uVar17 = 3;
    if (uVar13 != 3) {
      bVar29 = ((*(uint *)(in + sVar8) ^ *puVar24) & 0xffffff) != 0;
      local_98 = (uint *)(in + sVar8);
      if (bVar29) {
        local_98 = puVar24;
      }
      uVar17 = (ulong)uVar13;
      if (!bVar29) {
        uVar17 = 3;
      }
    }
    if ((short)uVar27 < sVar25) {
      do {
        uVar18 = uVar18 - 1;
        if (*(uint *)(in + sVar25) == *puVar24) {
          local_98 = (uint *)(in + sVar25);
          uVar26 = 4;
          if (0xffffffdf < (uint)local_a8 - 0x24) goto LAB_0010159f;
          if (*(ulong *)(local_98 + 1) != *(ulong *)(puVar24 + 1)) {
            uVar17 = *(ulong *)(puVar24 + 1) ^ *(ulong *)(local_98 + 1);
            uVar14 = 4;
            goto LAB_001015e3;
          }
          if (*(ulong *)(local_98 + 3) != *(ulong *)(puVar24 + 3)) {
            uVar17 = *(ulong *)(puVar24 + 3) ^ *(ulong *)(local_98 + 3);
            uVar14 = 0xc;
            goto LAB_001015e3;
          }
          if (*(ulong *)(local_98 + 5) == *(ulong *)(puVar24 + 5)) {
            uVar26 = 0x24;
            if (*(ulong *)(local_98 + 7) == *(ulong *)(puVar24 + 7)) goto LAB_0010159f;
            uVar17 = *(ulong *)(puVar24 + 7) ^ *(ulong *)(local_98 + 7);
            uVar14 = 0x1c;
          }
          else {
            uVar17 = *(ulong *)(puVar24 + 5) ^ *(ulong *)(local_98 + 5);
            uVar14 = 0x14;
          }
          goto LAB_001015e3;
        }
        sVar25 = *(short *)((long)&c->p + (ulong)((int)sVar25 & 0x7fff) * 2 + 0x30000);
      } while (((short)uVar27 < sVar25) && (uVar18 != 0));
    }
  }
  goto LAB_00101621;
  while( true ) {
    puVar3 = (ulong *)((long)local_98 + uVar26);
    puVar4 = (ulong *)((long)puVar24 + uVar26);
    uVar26 = (ulong)(uVar14 + 8);
    if (*puVar3 != *puVar4) break;
LAB_0010159f:
    uVar14 = (uint)uVar26;
    uVar17 = uVar26;
    if ((uint)local_a8 < uVar14 + 8) goto joined_r0x0010187a;
  }
  uVar17 = *puVar4 ^ *puVar3;
LAB_001015e3:
  uVar26 = 0;
  if (uVar17 != 0) {
    for (; (uVar17 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
    }
  }
  uVar17 = (ulong)(((uint)(uVar26 >> 3) & 0x1fffffff) + uVar14);
LAB_001015ee:
  if (((uint)uVar17 < local_9c) &&
     (sVar25 = *(short *)((long)&c->p + (ulong)((int)sVar25 & 0x7fff) * 2 + 0x30000),
     uVar18 != 0 && (short)uVar27 < sVar25)) {
LAB_001013c7:
    do {
      while( true ) {
        uVar18 = uVar18 - 1;
        puVar1 = (uint *)(in + sVar25);
        if ((*(int *)(((uVar17 & 0xffffffff) - 3) + (long)puVar1) ==
             *(int *)((long)puVar24 + ((uVar17 & 0xffffffff) - 3))) && (*puVar1 == *puVar24)) break;
        sVar25 = *(short *)((long)&c->p + (ulong)((int)sVar25 & 0x7fff) * 2 + 0x30000);
        if ((sVar25 <= (short)uVar27) || (uVar18 == 0)) goto LAB_00101621;
      }
      uVar14 = 4;
      if ((uint)local_a8 - 0x24 < 0xffffffe0) {
        if (*(ulong *)(puVar1 + 1) == *(ulong *)(puVar24 + 1)) {
          if (*(ulong *)(puVar1 + 3) == *(ulong *)(puVar24 + 3)) {
            if (*(ulong *)(puVar1 + 5) == *(ulong *)(puVar24 + 5)) {
              uVar14 = 0x24;
              if (*(ulong *)(puVar1 + 7) == *(ulong *)(puVar24 + 7)) goto LAB_00101468;
              uVar26 = *(ulong *)(puVar24 + 7) ^ *(ulong *)(puVar1 + 7);
              uVar20 = 0x1c;
            }
            else {
              uVar26 = *(ulong *)(puVar24 + 5) ^ *(ulong *)(puVar1 + 5);
              uVar20 = 0x14;
            }
          }
          else {
            uVar26 = *(ulong *)(puVar24 + 3) ^ *(ulong *)(puVar1 + 3);
            uVar20 = 0xc;
          }
        }
        else {
          uVar26 = *(ulong *)(puVar24 + 1) ^ *(ulong *)(puVar1 + 1);
          uVar20 = 4;
        }
      }
      else {
LAB_00101468:
        do {
          uVar20 = uVar14;
          uVar26 = (ulong)uVar20;
          uVar14 = uVar20;
          if ((uint)local_a8 < uVar20 + 8) goto joined_r0x00101503;
          uVar14 = uVar20 + 8;
        } while (*(ulong *)((long)puVar1 + uVar26) == *(ulong *)((long)puVar24 + uVar26));
        uVar26 = *(ulong *)((long)puVar24 + uVar26) ^ *(ulong *)((long)puVar1 + uVar26);
      }
      uVar9 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      uVar20 = ((uint)(uVar9 >> 3) & 0x1fffffff) + uVar20;
LAB_001014b1:
      if (((uint)uVar17 < uVar20) && (uVar17 = (ulong)uVar20, local_98 = puVar1, local_9c <= uVar20)
         ) {
        uVar17 = (ulong)uVar20;
        break;
      }
      sVar25 = *(short *)((long)&c->p + (ulong)((int)sVar25 & 0x7fff) * 2 + 0x30000);
      if ((sVar25 <= (short)uVar27) || (uVar18 == 0)) break;
    } while( true );
  }
LAB_00101621:
  uVar14 = (uint)uVar17;
  if (uVar12 <= uVar14) {
    uVar20 = (uint)((long)puVar24 - (long)local_98);
    if ((3 < uVar14) || (uVar20 < 0x1001)) {
      bVar7 = ""[uVar20 - 1 >> (byte)(0x100 - uVar20 >> 0x1d)];
      puVar6 = (c->freqs).offset + ((ulong)""[uVar17 & 0xffffffff] - 0x1f);
      *puVar6 = *puVar6 + 1;
      uVar20 = (uint)bVar7 + (0x100 - uVar20 >> 0x1d) * 2;
      puVar6 = (c->freqs).offset + uVar20;
      *puVar6 = *puVar6 + 1;
      puVar6 = (c->split_stats).new_observations + (ulong)(8 < uVar14) + 8;
      *puVar6 = *puVar6 + 1;
      puVar6 = &(c->split_stats).num_new_observations;
      *puVar6 = *puVar6 + 1;
      puVar1 = (uint *)((long)(c->freqs).litlen + local_80 + -0x28);
      *puVar1 = *puVar1 | uVar14 << 0x17;
      *(short *)((long)(c->freqs).litlen + local_80 + -0x24) =
           (short)((long)puVar24 - (long)local_98);
      *(short *)((long)(c->freqs).litlen + local_80 + -0x22) = (short)uVar20;
      *(undefined4 *)((long)(c->freqs).litlen + local_80 + -0x20) = 0;
      pbVar19 = (byte *)((long)puVar24 + 1);
      if ((long)(ulong)(uVar14 + 4) <= (long)puVar21 - (long)pbVar19) {
        iVar15 = uVar14 - 1;
        uVar14 = (int)pbVar19 - (int)in;
        do {
          if (uVar14 == 0x8000) {
            lVar16 = 0;
            do {
              auVar30 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16),auVar31);
              *(undefined1 (*) [16])((long)&c->p + lVar16) = auVar30;
              auVar30 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10),auVar31);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10) = auVar30;
              auVar30 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20),auVar31);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20) = auVar30;
              auVar30 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30),auVar31);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30) = auVar30;
              lVar16 = lVar16 + 0x40;
            } while (lVar16 != 0x40000);
            in = in + 0x8000;
            uVar14 = 0;
          }
          *(short *)((long)&c->p + (ulong)uVar22 * 2) = (short)uVar14;
          *(undefined2 *)((long)&c->p + (ulong)uVar14 * 2 + 0x30000) =
               *(undefined2 *)((long)&c->p + uVar28 * 2 + 0x10000);
          *(short *)((long)&c->p + uVar28 * 2 + 0x10000) = (short)uVar14;
          puVar1 = (uint *)(pbVar19 + 1);
          pbVar19 = pbVar19 + 1;
          uVar22 = (*puVar1 & 0xffffff) * 0x1e35a7bd >> 0x11;
          uVar28 = (ulong)(*puVar1 * 0x1e35a7bd >> 0x10);
          uVar14 = uVar14 + 1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      local_80 = local_80 + 8;
      puVar24 = (uint *)((long)puVar24 + (uVar17 & 0xffffffff));
      goto LAB_001017e4;
    }
  }
  bVar7 = (byte)*puVar24;
  puVar6 = (c->freqs).litlen + bVar7;
  *puVar6 = *puVar6 + 1;
  puVar6 = (c->split_stats).new_observations + ((bVar7 & 1) + (uint)(bVar7 >> 6) * 2);
  *puVar6 = *puVar6 + 1;
  puVar6 = &(c->split_stats).num_new_observations;
  *puVar6 = *puVar6 + 1;
  puVar24 = (uint *)((long)puVar24 + 1);
  piVar5 = (int *)((long)(c->freqs).litlen + local_80 + -0x28);
  *piVar5 = *piVar5 + 1;
LAB_001017e4:
  local_78 = (int)data;
  if (((puVar23 <= puVar24) || (0xa323f < local_80)) ||
     ((0x1ff < (c->split_stats).num_new_observations &&
      ((4999 < (long)puVar21 - (long)puVar24 && 4999 < (long)puVar24 - (long)data &&
       (_Var11 = do_end_block_check(&c->split_stats,(int)puVar24 - local_78),
       auVar31 = _DAT_0010d070, _Var11)))))) goto LAB_001018ba;
  goto LAB_00101236;
joined_r0x0010187a:
  if ((uint)local_a8 <= uVar14) goto LAB_001015ee;
  if (*(byte *)((long)local_98 + uVar26) != *(byte *)((long)puVar24 + uVar26)) {
    uVar17 = uVar26 & 0xffffffff;
    goto LAB_001015ee;
  }
  uVar26 = uVar26 + 1;
  uVar14 = (uint)uVar26;
  uVar17 = local_a8;
  goto joined_r0x0010187a;
joined_r0x00101503:
  if ((uint)local_a8 <= uVar14) goto LAB_001014b1;
  if (in[uVar26 + (long)sVar25] != *(byte *)((long)puVar24 + uVar26)) {
    uVar20 = (uint)uVar26;
    goto LAB_001014b1;
  }
  uVar26 = uVar26 + 1;
  uVar20 = (uint)local_a8;
  uVar14 = (uint)uVar26;
  goto joined_r0x00101503;
LAB_001018ba:
  deflate_finish_block
            (c,os,(u8 *)data,(int)puVar24 - local_78,(c->p).g.sequences,puVar24 == puVar21);
  if ((puVar24 == puVar21) || (data = puVar24, os->overflow == true)) {
    return;
  }
  goto LAB_001011b2;
}

Assistant:

static void
deflate_compress_greedy(struct libdeflate_compressor * restrict c,
			const u8 *in, size_t in_nbytes,
			struct deflate_output_bitstream *os)
{
	const u8 *in_next = in;
	const u8 *in_end = in_next + in_nbytes;
	const u8 *in_cur_base = in_next;
	u32 max_len = DEFLATE_MAX_MATCH_LEN;
	u32 nice_len = MIN(c->nice_match_length, max_len);
	u32 next_hashes[2] = {0, 0};

	hc_matchfinder_init(&c->p.g.hc_mf);

	do {
		/* Starting a new DEFLATE block */

		const u8 * const in_block_begin = in_next;
		const u8 * const in_max_block_end = choose_max_block_end(
				in_next, in_end, SOFT_MAX_BLOCK_LENGTH);
		struct deflate_sequence *seq = c->p.g.sequences;
		u32 min_len;

		init_block_split_stats(&c->split_stats);
		deflate_begin_sequences(c, seq);
		min_len = calculate_min_match_len(in_next,
						  in_max_block_end - in_next,
						  c->max_search_depth);
		do {
			u32 length;
			u32 offset;

			adjust_max_and_nice_len(&max_len, &nice_len,
						in_end - in_next);
			length = hc_matchfinder_longest_match(
						&c->p.g.hc_mf,
						&in_cur_base,
						in_next,
						min_len - 1,
						max_len,
						nice_len,
						c->max_search_depth,
						next_hashes,
						&offset);

			if (length >= min_len &&
			    (length > DEFLATE_MIN_MATCH_LEN ||
			     offset <= 4096)) {
				/* Match found */
				deflate_choose_match(c, length, offset, true,
						     &seq);
				hc_matchfinder_skip_bytes(&c->p.g.hc_mf,
							  &in_cur_base,
							  in_next + 1,
							  in_end,
							  length - 1,
							  next_hashes);
				in_next += length;
			} else {
				/* No match found */
				deflate_choose_literal(c, *in_next++, true,
						       seq);
			}

			/* Check if it's time to output another block. */
		} while (in_next < in_max_block_end &&
			 seq < &c->p.g.sequences[SEQ_STORE_LENGTH] &&
			 !should_end_block(&c->split_stats,
					   in_block_begin, in_next, in_end));

		deflate_finish_block(c, os, in_block_begin,
				     in_next - in_block_begin,
				     c->p.g.sequences, in_next == in_end);
	} while (in_next != in_end && !os->overflow);
}